

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O1

qsizetype QtPrivate::indexOf<QString,QStringBuilder<QLatin1String,QString&>>
                    (QList<QString> *vector,QStringBuilder<QLatin1String,_QString_&> *u,
                    qsizetype from)

{
  ulong uVar1;
  QString *pQVar2;
  long lVar3;
  char cVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  qsizetype *pqVar8;
  long in_FS_OFFSET;
  QStringView QVar9;
  QStringView QVar10;
  QString local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (from < 0) {
    from = from + (vector->d).size;
    if (from < 1) {
      from = 0;
    }
  }
  uVar1 = (vector->d).size;
  if ((ulong)from < uVar1) {
    pQVar2 = (vector->d).ptr;
    pqVar8 = &pQVar2[from].d.size;
    lVar6 = uVar1 * 0x18 + from * -0x18;
    lVar3 = 0x18 - (long)(pQVar2 + from);
    do {
      lVar7 = lVar3;
      lVar5 = lVar6;
      lVar6 = lVar5;
      if (lVar5 == 0) goto LAB_002bf95d;
      QStringBuilder<QLatin1String,_QString_&>::convertTo<QString>(&local_50,u);
      if (*pqVar8 == local_50.d.size) {
        QVar9.m_data = (char16_t *)pqVar8[-1];
        QVar9.m_size = *pqVar8;
        QVar10.m_data = local_50.d.ptr;
        QVar10.m_size = local_50.d.size;
        cVar4 = QtPrivate::equalStrings(QVar9,QVar10);
      }
      else {
        cVar4 = '\0';
      }
      if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
        }
      }
      pqVar8 = pqVar8 + 3;
      lVar6 = lVar5 + -0x18;
      lVar3 = lVar7 + -0x18;
    } while (cVar4 == '\0');
    lVar6 = (-((long)&(vector->d).ptr[-1].d.d + lVar7) >> 3) * -0x5555555555555555;
LAB_002bf95d:
    if (lVar5 != 0) goto LAB_002bf969;
  }
  lVar6 = -1;
LAB_002bf969:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return lVar6;
  }
  __stack_chk_fail();
}

Assistant:

qsizetype indexOf(const QList<T> &vector, const U &u, qsizetype from) noexcept
{
    if (from < 0)
        from = qMax(from + vector.size(), qsizetype(0));
    if (from < vector.size()) {
        auto n = vector.begin() + from - 1;
        auto e = vector.end();
        while (++n != e)
            if (*n == u)
                return qsizetype(n - vector.begin());
    }
    return -1;
}